

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatetimeedit.cpp
# Opt level: O2

void __thiscall QCalendarPopup::mousePressEvent(QCalendarPopup *this,QMouseEvent *event)

{
  long lVar1;
  char cVar2;
  QWidget *widget;
  QStyle *pQVar3;
  QPoint QVar4;
  long in_FS_OFFSET;
  undefined1 auVar5 [16];
  QPointF local_118;
  QPoint local_108;
  QRect local_100;
  QPointF local_f0;
  QPoint local_e0;
  QPoint local_d8;
  int local_d0;
  int local_cc;
  QStyleOptionComboBox opt;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  widget = (QWidget *)
           QtPrivate::qobject_cast_helper<QDateTimeEdit*,QObject>
                     (*(QObject **)(*(long *)&(this->super_QWidget).field_0x8 + 0x10));
  if (widget == (QWidget *)0x0) goto LAB_003c4707;
  memset(&opt,0xaa,0x90);
  QStyleOptionComboBox::QStyleOptionComboBox(&opt);
  QStyleOption::initFrom((QStyleOption *)&opt,widget);
  pQVar3 = QWidget::style(widget);
  auVar5 = (**(code **)(*(long *)pQVar3 + 0xd8))(pQVar3,1,&opt,4,widget);
  local_f0.xp = auVar5._0_8_;
  QVar4 = QWidget::mapToGlobal(widget,(QPoint *)&local_f0);
  local_d8.xp = QVar4.xp.m_i;
  local_d0 = (local_d8.xp.m_i - auVar5._0_4_) + auVar5._8_4_;
  local_d8.yp = QVar4.yp.m_i;
  local_cc = auVar5._12_4_ + (local_d8.yp.m_i - auVar5._4_4_);
  local_f0 = QSinglePointEvent::globalPosition((QSinglePointEvent *)event);
  local_e0 = QPointF::toPoint(&local_f0);
  cVar2 = QRect::contains(&local_d8,SUB81(&local_e0,0));
  if (cVar2 == '\0') {
    local_100 = QWidget::rect(&this->super_QWidget);
    local_118 = QSinglePointEvent::position((QSinglePointEvent *)event);
    local_108 = QPointF::toPoint(&local_118);
    cVar2 = QRect::contains((QPoint *)&local_100,SUB81(&local_108,0));
    if (cVar2 != '\0') goto LAB_003c46ef;
  }
  else {
LAB_003c46ef:
    QWidget::setAttribute(&this->super_QWidget,WA_NoMouseReplay,true);
  }
  QStyleOptionComboBox::~QStyleOptionComboBox(&opt);
LAB_003c4707:
  QWidget::mousePressEvent(&this->super_QWidget,event);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QCalendarPopup::mousePressEvent(QMouseEvent *event)
{
    QDateTimeEdit *dateTime = qobject_cast<QDateTimeEdit *>(parentWidget());
    if (dateTime) {
        QStyleOptionComboBox opt;
        opt.initFrom(dateTime);
        QRect arrowRect = dateTime->style()->subControlRect(QStyle::CC_ComboBox, &opt,
                                                            QStyle::SC_ComboBoxArrow, dateTime);
        arrowRect.moveTo(dateTime->mapToGlobal(arrowRect .topLeft()));
        if (arrowRect.contains(event->globalPosition().toPoint()) || rect().contains(event->position().toPoint()))
            setAttribute(Qt::WA_NoMouseReplay);
    }
    QWidget::mousePressEvent(event);
}